

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void kratos::topological_sort_helper
               (PackedStructGraph *g,PackedStructNode *node,
               unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
               *visited,queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                        *queue)

{
  set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  *psVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  PackedStructNode *local_40;
  PackedStructNode *node_local;
  
  local_40 = node;
  node_local = (PackedStructNode *)queue;
  std::
  _Hashtable<kratos::PackedStructNode*,kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>,std::__detail::_Identity,std::equal_to<kratos::PackedStructNode*>,std::hash<kratos::PackedStructNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<kratos::PackedStructNode*&>
            ((_Hashtable<kratos::PackedStructNode*,kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>,std::__detail::_Identity,std::equal_to<kratos::PackedStructNode*>,std::hash<kratos::PackedStructNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_40);
  psVar1 = &local_40->children;
  for (p_Var3 = (local_40->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = std::
            _Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&visited->_M_h,(key_type *)(p_Var3 + 1));
    if (iVar2.super__Node_iterator_base<kratos::PackedStructNode_*,_false>._M_cur ==
        (__node_type *)0x0) {
      topological_sort_helper
                (g,*(PackedStructNode **)(p_Var3 + 1),visited,
                 (queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                  *)node_local);
    }
  }
  std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::push_back
            ((deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_> *)
             node_local,&local_40);
  return;
}

Assistant:

void topological_sort_helper(PackedStructGraph *g, PackedStructNode *node,
                             std::unordered_set<PackedStructNode *> &visited,
                             std::queue<PackedStructNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        if (visited.find(child) == visited.end()) {
            // visit it
            topological_sort_helper(g, child, visited, queue);
        }
    }
    queue.push(node);
}